

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatVehicle.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::Encode
          (GED_BasicGroundCombatVehicle *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GED_BasicGroundCombatVehicle *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16EntityID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16Offsets[0]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16Offsets[1]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16Offsets[2]);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_EA).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Ori[0]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Ori[1]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Ori[2]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Spd);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8TrrtAz);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8GnElv);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8TrrtSlwRt);
  KDataStream::operator<<(pKVar1,this->m_i8GnElvRt);
  return;
}

Assistant:

void GED_BasicGroundCombatVehicle::Encode( KDataStream & stream ) const
{
    stream << m_ui16EntityID
           << m_i16Offsets[0]
           << m_i16Offsets[1]
           << m_i16Offsets[2]
           << KDIS_STREAM m_EA
           << m_i8Ori[0]
           << m_i8Ori[1]
           << m_i8Ori[2]
           << m_i8Spd
           << m_i8TrrtAz
           << m_i8GnElv
           << m_i8TrrtSlwRt
           << m_i8GnElvRt;
}